

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_csv_reader<std::__cxx11::stringstream&>
          (basic_csv_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_json_visitor<char> *visitor,basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc)

{
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_R8;
  allocator<char> *in_stack_00000218;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_stack_00000220;
  basic_csv_decode_options<char> *in_stack_00000228;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000230;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68
  ;
  text_source_adaptor<jsoncons::stream_source<char>_> *in_stack_ffffffffffffff70;
  
  basic_default_json_visitor<char>::basic_default_json_visitor
            ((basic_default_json_visitor<char> *)in_stack_ffffffffffffff70);
  text_source_adaptor<jsoncons::stream_source<char>>::
  text_source_adaptor<std::__cxx11::stringstream&>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(undefined8 *)(in_RDI + 0x1a8) = in_RDX;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            (in_R8,in_RCX);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x498999);
  return;
}

Assistant:

basic_csv_reader(Sourceable&& source,
                         basic_json_visitor<CharT>& visitor,
                         const basic_csv_decode_options<CharT>& options,
                         std::function<bool(csv_errc,const ser_context&)> err_handler, 
                         const Allocator& alloc = Allocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options, err_handler, alloc)
             
        {
        }